

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O1

int coda_cursor_read_char_array(coda_cursor *cursor,char *dst,coda_array_ordering array_ordering)

{
  coda_type_class cVar1;
  coda_backend cVar2;
  int iVar3;
  int iVar4;
  coda_type *pcVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *message;
  coda_native_type native_type;
  long lVar9;
  
  if (((cursor == (coda_cursor *)0x0) || (lVar9 = (long)cursor->n, lVar9 < 1)) ||
     (pcVar5 = (coda_type *)cursor->stack[lVar9 - 1U & 0xffffffff].type, pcVar5 == (coda_type *)0x0)
     ) {
    pcVar7 = "invalid cursor argument (%s:%u)";
    uVar8 = 0x1028;
LAB_00129ec4:
    coda_set_error(-100,pcVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,uVar8);
    return -1;
  }
  if (dst == (char *)0x0) {
    pcVar7 = "dst argument is NULL (%s:%u)";
    uVar8 = 0x102d;
    goto LAB_00129ec4;
  }
  if (99 < pcVar5->format) {
    pcVar5 = *(coda_type **)&pcVar5->type_class;
  }
  if (pcVar5->type_class != coda_array_class) {
    pcVar7 = coda_type_get_class_name(pcVar5->type_class);
    message = "cursor does not refer to an array (current type is %s)";
LAB_00129f15:
    coda_set_error(-0x69,message,pcVar7);
    return -1;
  }
  pcVar5 = *(coda_type **)(pcVar5 + 1);
  cVar1 = pcVar5->type_class;
  piVar6 = (int *)__tls_get_addr(&PTR_001e0ea8);
  if (((cVar1 != coda_integer_class) && (cVar1 != coda_real_class)) ||
     ((*piVar6 == 0 || (native_type = coda_native_type_double, pcVar5[1].name == (char *)0x0)))) {
    native_type = pcVar5->read_type;
  }
  if (native_type != coda_native_type_char) {
    pcVar7 = coda_type_get_native_type_name(native_type);
    message = "can not read %s data using a char data type";
    goto LAB_00129f15;
  }
  cVar2 = (cursor->stack[lVar9 + -1].type)->backend;
  switch(cVar2) {
  case coda_backend_memory:
    iVar3 = coda_mem_cursor_read_char_array(cursor,dst,array_ordering);
    goto LAB_00129f9d;
  case coda_backend_hdf4:
    coda_set_error(-0xb,(char *)0x0);
    iVar3 = -1;
    goto LAB_00129f9d;
  case coda_backend_hdf5:
  case coda_backend_grib:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                  ,0x544,"int read_char_array(const coda_cursor *, char *, coda_array_ordering)");
  case coda_backend_cdf:
    iVar4 = coda_cdf_cursor_read_char_array(cursor,dst);
    break;
  case coda_backend_netcdf:
    iVar4 = coda_netcdf_cursor_read_char_array(cursor,dst);
    break;
  default:
    if (cVar2 == coda_backend_binary) {
      iVar3 = coda_bin_cursor_read_char_array(cursor,dst,array_ordering);
      goto LAB_00129f9d;
    }
    if (cVar2 == coda_backend_ascii) {
      iVar3 = coda_ascii_cursor_read_char_array(cursor,dst,array_ordering);
      goto LAB_00129f9d;
    }
    goto LAB_00129f85;
  }
  iVar3 = -1;
  if (iVar4 == 0) {
LAB_00129f85:
    if (array_ordering == coda_array_ordering_c) {
      iVar3 = 0;
    }
    else {
      iVar3 = transpose_array(cursor,dst,1);
    }
  }
LAB_00129f9d:
  return -(uint)(iVar3 != 0);
}

Assistant:

LIBCODA_API int coda_cursor_read_char_array(const coda_cursor *cursor, char *dst, coda_array_ordering array_ordering)
{
    coda_native_type read_type;
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    if (get_array_element_read_type(type, &read_type) != 0)
    {
        return -1;
    }
    switch (read_type)
    {
        case coda_native_type_char:
            if (read_char_array(cursor, dst, array_ordering) != 0)
            {
                return -1;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a char data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}